

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O0

int __thiscall
reflection::Object::KeyCompareWithValue<std::__cxx11::string>
          (Object *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *_name)

{
  bool bVar1;
  String *pSVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *_name_local;
  Object *this_local;
  
  pSVar2 = name(this);
  pcVar3 = flatbuffers::String::c_str(pSVar2);
  bVar1 = std::operator<(pcVar3,_name);
  if (bVar1) {
    this_local._4_4_ = -1;
  }
  else {
    pSVar2 = name(this);
    pcVar3 = flatbuffers::String::c_str(pSVar2);
    bVar1 = std::operator<(_name,pcVar3);
    if (bVar1) {
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int KeyCompareWithValue(const StringType& _name) const {
    if (name()->c_str() < _name) return -1;
    if (_name < name()->c_str()) return 1;
    return 0;
  }